

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

uint * Gia_ManTerStateCreate(Gia_ManTer_t *p)

{
  int iVar1;
  int iVar2;
  uint *pInfo;
  uint *pRes;
  int nPis;
  int Value;
  int i;
  Gia_ManTer_t *p_local;
  
  iVar1 = Gia_ManPiNum(p->pAig);
  pInfo = Gia_ManTerStateAlloc(p->nStateWords);
  nPis = iVar1;
  while( true ) {
    iVar2 = Gia_ManCiNum(p->pAig);
    if (iVar2 <= nPis) break;
    iVar2 = Gia_ManTerSimInfoGet(p->pDataSimCis,nPis);
    Gia_ManTerSimInfoSet(pInfo,nPis - iVar1,iVar2);
    if (iVar2 == 1) {
      p->pCount0[nPis - iVar1] = p->pCount0[nPis - iVar1] + 1;
    }
    if (iVar2 == 3) {
      p->pCountX[nPis - iVar1] = p->pCountX[nPis - iVar1] + 1;
    }
    nPis = nPis + 1;
  }
  Vec_PtrPush(p->vStates,pInfo);
  return pInfo;
}

Assistant:

unsigned * Gia_ManTerStateCreate( Gia_ManTer_t * p )
{
    int i, Value, nPis = Gia_ManPiNum(p->pAig);
    unsigned * pRes = Gia_ManTerStateAlloc( p->nStateWords );
    for ( i = nPis; i < Gia_ManCiNum(p->pAig); i++ )
    {
        Value = Gia_ManTerSimInfoGet( p->pDataSimCis, i );
        Gia_ManTerSimInfoSet( pRes, i-nPis, Value );
        if ( Value == GIA_ZER )
            p->pCount0[i-nPis]++;
        if ( Value == GIA_UND )
            p->pCountX[i-nPis]++;
    }
    Vec_PtrPush( p->vStates, pRes );
    return pRes;    
}